

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemDecTigerWithCreaks.cpp
# Opt level: O0

double __thiscall
ProblemDecTigerWithCreaks::GetRewardForAgent
          (ProblemDecTigerWithCreaks *this,Index s,Index ja,Index agentI)

{
  Index IVar1;
  undefined8 uVar2;
  int in_ECX;
  Index in_EDX;
  int in_ESI;
  Index in_stack_ffffffffffffff58;
  Index in_stack_ffffffffffffff5c;
  Index in_stack_ffffffffffffff60;
  Index in_stack_ffffffffffffff64;
  Index in_stack_ffffffffffffff68;
  Index in_stack_ffffffffffffff6c;
  Index in_stack_ffffffffffffff70;
  Index in_stack_ffffffffffffff74;
  double local_8;
  
  if (in_ECX == 0) {
    if (in_ESI == 0) {
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (in_EDX == IVar1) {
        return 10.0;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (in_EDX == IVar1) {
        return -100.0;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (in_EDX == IVar1) {
        return 10.0;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (in_EDX == IVar1) {
        return -100.0;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (in_EDX == IVar1) {
        return -1.0;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (in_EDX == IVar1) {
        return -1.0;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (in_EDX == IVar1) {
        return 10.0;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (in_EDX == IVar1) {
        return -1.0;
      }
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (in_EDX == IVar1) {
        return -100.0;
      }
    }
    else if (in_ESI != 1) goto LAB_00994dfa;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      return -100.0;
    }
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      return 10.0;
    }
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      return -100.0;
    }
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      return 10.0;
    }
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      return -1.0;
    }
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      return -1.0;
    }
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      return -100.0;
    }
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      return -1.0;
    }
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      return 10.0;
    }
  }
  else if (in_ECX != 1) goto LAB_009952b4;
LAB_00994dfa:
  if (in_ESI == 0) {
    in_stack_ffffffffffffff74 = in_EDX;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_EDX,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
                                ,in_stack_ffffffffffffff68);
    if (in_stack_ffffffffffffff74 == IVar1) {
      return 10.0;
    }
    in_stack_ffffffffffffff70 = in_EDX;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_EDX),in_stack_ffffffffffffff6c
                                ,in_stack_ffffffffffffff68);
    if (in_stack_ffffffffffffff70 == IVar1) {
      return -100.0;
    }
    in_stack_ffffffffffffff6c = in_EDX;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_EDX
                                ,in_stack_ffffffffffffff68);
    if (in_stack_ffffffffffffff6c == IVar1) {
      return -100.0;
    }
    in_stack_ffffffffffffff68 = in_EDX;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_EDX);
    if (in_stack_ffffffffffffff68 == IVar1) {
      return 10.0;
    }
    in_stack_ffffffffffffff64 = in_EDX;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_stack_ffffffffffffff64 == IVar1) {
      return -1.0;
    }
    in_stack_ffffffffffffff60 = in_EDX;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_stack_ffffffffffffff60 == IVar1) {
      return 10.0;
    }
    in_stack_ffffffffffffff5c = in_EDX;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_stack_ffffffffffffff5c == IVar1) {
      return -1.0;
    }
    in_stack_ffffffffffffff58 = in_EDX;
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_stack_ffffffffffffff58 == IVar1) {
      return -100.0;
    }
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      return -1.0;
    }
  }
  else if (in_ESI != 1) goto LAB_009952b4;
  IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  if (in_EDX == IVar1) {
    local_8 = -100.0;
  }
  else {
    IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    if (in_EDX == IVar1) {
      local_8 = 10.0;
    }
    else {
      IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if (in_EDX == IVar1) {
        local_8 = 10.0;
      }
      else {
        IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                    in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        if (in_EDX == IVar1) {
          local_8 = -100.0;
        }
        else {
          IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                      in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
          if (in_EDX == IVar1) {
            local_8 = -1.0;
          }
          else {
            IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),in_stack_ffffffffffffff6c,
                                        in_stack_ffffffffffffff68);
            if (in_EDX == IVar1) {
              local_8 = -100.0;
            }
            else {
              IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                          CONCAT44(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70),
                                          in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
              if (in_EDX == IVar1) {
                local_8 = -1.0;
              }
              else {
                IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                            CONCAT44(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70),
                                            in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
                if (in_EDX == IVar1) {
                  local_8 = 10.0;
                }
                else {
                  IVar1 = GetJointActionIndex((ProblemDecTigerWithCreaks *)
                                              CONCAT44(in_stack_ffffffffffffff74,
                                                       in_stack_ffffffffffffff70),
                                              in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
                  if (in_EDX != IVar1) {
LAB_009952b4:
                    uVar2 = __cxa_allocate_exception(0x28);
                    E::E((E *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
                    __cxa_throw(uVar2,&E::typeinfo,E::~E);
                  }
                  local_8 = -1.0;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

double ProblemDecTigerWithCreaks::GetRewardForAgent(Index s,
                                                    Index ja,
                                                    Index agentI) const
{
    switch(agentI)
    {
    case 0:
        switch(s)
        {
        case SLEFT:
        {
            if     (ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT)) return(10);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT)) return(-100);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT)) return(10);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT)) return(-100);
            else if(ja==GetJointActionIndex(LISTEN,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT)) return(-1);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN)) return(10);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT)) return(-1);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN)) return(-100);
        }
        case SRIGHT:
        {
            if     (ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT)) return(-100);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT)) return(10);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT)) return(-100);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT)) return(10);
            else if(ja==GetJointActionIndex(LISTEN,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT)) return(-1);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN)) return(-100);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT)) return(-1);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN)) return(10);
        }
        }
    case 1:
        switch(s)
        {
        case SLEFT:
        {
            if     (ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT)) return(10);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT)) return(-100);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT)) return(-100);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT)) return(10);
            else if(ja==GetJointActionIndex(LISTEN,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT)) return(10);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT)) return(-100);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN)) return(-1);
        }
        case SRIGHT:
        {
            if     (ja==GetJointActionIndex(OPENRIGHT,OPENRIGHT)) return(-100);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENLEFT)) return(10);
            else if(ja==GetJointActionIndex(OPENRIGHT,OPENLEFT)) return(10);
            else if(ja==GetJointActionIndex(OPENLEFT,OPENRIGHT)) return(-100);
            else if(ja==GetJointActionIndex(LISTEN,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENRIGHT)) return(-100);
            else if(ja==GetJointActionIndex(OPENRIGHT,LISTEN)) return(-1);
            else if(ja==GetJointActionIndex(LISTEN,OPENLEFT)) return(10);
            else if(ja==GetJointActionIndex(OPENLEFT,LISTEN)) return(-1);
        }
        }
    }

    throw(E("ProblemDecTigerWithCreaks::GetRewardForAgent should never get here"));
    return(42);
}